

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::ParseFunctionGenerator
          (ParseFunctionGenerator *this,Descriptor *descriptor,int max_has_bit_index,
          Span<const_int> has_bit_indices,Span<const_int> inlined_string_indices,Options *options,
          MessageSCCAnalyzer *scc_analyzer,
          flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,int index_in_file_messages)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  pointer ppFVar1;
  Span<const_int> inlined_string_indices_00;
  undefined8 __p;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  this_01;
  Descriptor *descriptor_00;
  MessageSCCAnalyzer *scc_analyzer_00;
  Span<const_google::protobuf::FieldDescriptor_*const> ordered_fields;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> field_options;
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  fields;
  undefined1 local_100 [64];
  TailCallTableInfo local_c0;
  
  this->descriptor_ = descriptor;
  this->scc_analyzer_ = scc_analyzer;
  this->options_ = options;
  this_00 = &this->variables_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)vars);
  (this->tc_table_info_)._M_t.
  super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>._M_head_impl =
       (TailCallTableInfo *)0x0;
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&this->inlined_string_indices_,
             inlined_string_indices.ptr_,inlined_string_indices.ptr_ + inlined_string_indices.len_,
             (allocator_type *)(local_100 + 0x40));
  GetOrderedFields(&this->ordered_fields_,this->descriptor_);
  this->num_hasbits_ = max_has_bit_index;
  this->index_in_file_messages_ = index_in_file_messages;
  ppFVar1 = (this->ordered_fields_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ordered_fields.len_ =
       (long)(this->ordered_fields_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3;
  scc_analyzer_00 = this->scc_analyzer_;
  local_100._32_8_ =
       (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_100._40_8_ =
       (long)(this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish - local_100._32_8_ >> 2;
  inlined_string_indices_00.len_ = local_100._40_8_;
  inlined_string_indices_00.ptr_ = (pointer)local_100._32_8_;
  ordered_fields.ptr_ = ppFVar1;
  local_100._48_8_ = (pointer)has_bit_indices.ptr_;
  local_100._56_8_ = (pointer)has_bit_indices.len_;
  BuildFieldOptions((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                     *)(local_100 + 8),(Descriptor *)local_100._40_8_,ordered_fields,this->options_,
                    scc_analyzer_00,has_bit_indices,inlined_string_indices_00);
  field_options.ptr_ = (pointer)((long)(local_100._16_8_ - local_100._8_8_) >> 5);
  field_options.len_ = (size_type)scc_analyzer_00;
  BuildTcTableInfoFromDescriptor
            ((TailCallTableInfo *)(local_100 + 0x40),(ParseFunctionGenerator *)this->descriptor_,
             (Descriptor *)this->options_,(Options *)local_100._8_8_,field_options);
  std::
  make_unique<google::protobuf::internal::TailCallTableInfo,google::protobuf::internal::TailCallTableInfo>
            ((TailCallTableInfo *)local_100);
  __p = local_100._0_8_;
  local_100._0_8_ =
       (__uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
        )0x0;
  std::
  __uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  ::reset((__uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           *)&this->tc_table_info_,(pointer)__p);
  std::
  unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  ::~unique_ptr((unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
                 *)local_100);
  protobuf::internal::TailCallTableInfo::~TailCallTableInfo((TailCallTableInfo *)(local_100 + 0x40))
  ;
  SetCommonMessageDataVariables(this->descriptor_,this_00);
  SetUnknownFieldsVariable(this->descriptor_,this->options_,this_00);
  ClassName_abi_cxx11_((string *)(local_100 + 0x40),(cpp *)descriptor,descriptor_00);
  this_01 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)this_00,(key_arg<char[10]> *)0xff9b1e);
  std::__cxx11::string::operator=((string *)this_01,(string *)(local_100 + 0x40));
  std::__cxx11::string::~string((string *)(local_100 + 0x40));
  std::
  _Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::~_Vector_base((_Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   *)(local_100 + 8));
  return;
}

Assistant:

ParseFunctionGenerator::ParseFunctionGenerator(
    const Descriptor* descriptor, int max_has_bit_index,
    absl::Span<const int> has_bit_indices,
    absl::Span<const int> inlined_string_indices, const Options& options,
    MessageSCCAnalyzer* scc_analyzer,
    const absl::flat_hash_map<absl::string_view, std::string>& vars,
    int index_in_file_messages)
    : descriptor_(descriptor),
      scc_analyzer_(scc_analyzer),
      options_(options),
      variables_(vars),
      // Copy the absl::Span into a vector owned by the class.
      inlined_string_indices_(inlined_string_indices.begin(),
                              inlined_string_indices.end()),
      ordered_fields_(GetOrderedFields(descriptor_)),
      num_hasbits_(max_has_bit_index),
      index_in_file_messages_(index_in_file_messages) {
  auto fields =
      BuildFieldOptions(descriptor_, ordered_fields_, options_, scc_analyzer_,
                        has_bit_indices, inlined_string_indices_);
  tc_table_info_ = std::make_unique<TailCallTableInfo>(
      BuildTcTableInfoFromDescriptor(descriptor_, options_, fields));
  SetCommonMessageDataVariables(descriptor_, &variables_);
  SetUnknownFieldsVariable(descriptor_, options_, &variables_);
  variables_["classname"] = ClassName(descriptor, false);
}